

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  int iVar7;
  uint uVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar7 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar7 < 0x136) {
    if (iVar7 - 0x94U < 2) {
LAB_00802722:
      uVar1 = data->SlotIndex1;
      uVar2 = data->SlotIndex2;
      uVar3 = data->Value;
      form = L" [%d][%d] = R%d ";
      goto LAB_00802734;
    }
    if ((iVar7 != 0x8e) && (iVar7 != 0x90)) goto LAB_00802743;
  }
  else {
    uVar8 = iVar7 - 0x136;
    if (0x1b < uVar8) {
LAB_00802743:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x3b4,"(false)","Unknown OpCode for OpLayoutElementSlotI2");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
      return;
    }
    if ((0xe846000U >> (uVar8 & 0x1f) & 1) != 0) goto LAB_00802722;
    if ((0x501U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00802743;
  }
  uVar1 = data->Value;
  uVar2 = data->SlotIndex1;
  uVar3 = data->SlotIndex2;
  form = L" R%d = [%d][%d] ";
LAB_00802734:
  Output::Print(form,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI2(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StInnerSlot:
            case OpCode::StInnerSlotChkUndecl:
            case OpCode::StInnerObjSlot:
            case OpCode::StInnerObjSlotChkUndecl:
            case OpCode::StEnvSlot:
            case OpCode::StEnvObjSlot:
            case OpCode::StEnvSlotChkUndecl:
            case OpCode::StEnvObjSlotChkUndecl:
            case OpCode::StModuleSlot:
                Output::Print(_u(" [%d][%d] = R%d "),data->SlotIndex1, data->SlotIndex2, data->Value);
                break;
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                Output::Print(_u(" R%d = [%d][%d] "),data->Value, data->SlotIndex1, data->SlotIndex2);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI2");
                break;
            }
        }
    }